

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O0

int ASN1_BIT_STRING_set_bit(ASN1_BIT_STRING *a,int n,int value)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  uchar *local_38;
  uchar *c;
  byte local_28;
  int iv;
  int v;
  int w;
  int value_local;
  int n_local;
  ASN1_BIT_STRING *a_local;
  
  iVar2 = n / 8;
  local_28 = (byte)(1 << (7 - ((byte)n & 7) & 0x1f));
  bVar1 = local_28 ^ 0xff;
  if (value == 0) {
    local_28 = 0;
  }
  if (a == (ASN1_BIT_STRING *)0x0) {
    return 0;
  }
  a->flags = a->flags & 0xfffffffffffffff0;
  if ((a->length < iVar2 + 1) || (a->data == (uchar *)0x0)) {
    if (value == 0) {
      return 1;
    }
    if (a->data == (uchar *)0x0) {
      local_38 = (uchar *)OPENSSL_malloc((long)(iVar2 + 1));
    }
    else {
      local_38 = (uchar *)OPENSSL_realloc(a->data,(long)(iVar2 + 1));
    }
    if (local_38 == (uchar *)0x0) {
      return 0;
    }
    if (0 < (iVar2 + 1) - a->length) {
      OPENSSL_memset(local_38 + a->length,0,(long)((iVar2 + 1) - a->length));
    }
    a->data = local_38;
    a->length = iVar2 + 1;
  }
  a->data[iVar2] = a->data[iVar2] & bVar1 | local_28;
  while( true ) {
    bVar3 = false;
    if (0 < a->length) {
      bVar3 = a->data[a->length + -1] == '\0';
    }
    if (!bVar3) break;
    a->length = a->length + -1;
  }
  return 1;
}

Assistant:

int ASN1_BIT_STRING_set_bit(ASN1_BIT_STRING *a, int n, int value) {
  int w, v, iv;
  unsigned char *c;

  w = n / 8;
  v = 1 << (7 - (n & 0x07));
  iv = ~v;
  if (!value) {
    v = 0;
  }

  if (a == NULL) {
    return 0;
  }

  a->flags &= ~(ASN1_STRING_FLAG_BITS_LEFT | 0x07);  // clear, set on write

  if ((a->length < (w + 1)) || (a->data == NULL)) {
    if (!value) {
      return 1;  // Don't need to set
    }
    if (a->data == NULL) {
      c = (unsigned char *)OPENSSL_malloc(w + 1);
    } else {
      c = (unsigned char *)OPENSSL_realloc(a->data, w + 1);
    }
    if (c == NULL) {
      return 0;
    }
    if (w + 1 - a->length > 0) {
      OPENSSL_memset(c + a->length, 0, w + 1 - a->length);
    }
    a->data = c;
    a->length = w + 1;
  }
  a->data[w] = ((a->data[w]) & iv) | v;
  while ((a->length > 0) && (a->data[a->length - 1] == 0)) {
    a->length--;
  }
  return 1;
}